

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::ternary_idx(Internal *this,int idx,int64_t *steps,int64_t *htrs)

{
  bool bVar1;
  Flags *pFVar2;
  Occs *pOVar3;
  size_type sVar4;
  size_type sVar5;
  int in_ESI;
  long in_RDI;
  int pivot;
  int neg;
  int pos;
  int64_t *in_stack_00000088;
  int64_t *in_stack_00000090;
  int in_stack_0000009c;
  Internal *in_stack_000000a0;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  bVar1 = active((Internal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
  if ((bVar1) &&
     (pFVar2 = flags((Internal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc), ((uint)*pFVar2 >> 10 & 1) != 0)) {
    pOVar3 = occs((Internal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
    sVar4 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::size(pOVar3);
    pOVar3 = occs((Internal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
    sVar5 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::size(pOVar3);
    if (((int)sVar4 <= *(int *)(in_RDI + 0xef0)) && ((int)sVar5 <= *(int *)(in_RDI + 0xef0))) {
      in_stack_ffffffffffffffc4 = in_ESI;
      if ((int)sVar5 < (int)sVar4) {
        in_stack_ffffffffffffffc4 = -in_ESI;
      }
      ternary_lit(in_stack_000000a0,in_stack_0000009c,in_stack_00000090,in_stack_00000088);
    }
    pFVar2 = flags((Internal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
    *pFVar2 = (Flags)((uint)*pFVar2 & 0xfffffbff);
  }
  return;
}

Assistant:

void Internal::ternary_idx (int idx, int64_t &steps, int64_t &htrs) {
  assert (0 < idx);
  assert (idx <= max_var);
  if (!active (idx))
    return;
  if (!flags (idx).ternary)
    return;
  int pos = occs (idx).size ();
  int neg = occs (-idx).size ();
  if (pos <= opts.ternaryocclim && neg <= opts.ternaryocclim) {
    LOG ("index %d has %zd positive and %zd negative occurrences", idx,
         occs (idx).size (), occs (-idx).size ());
    int pivot = (neg < pos ? -idx : idx);
    ternary_lit (pivot, steps, htrs);
  }
  flags (idx).ternary = false;
}